

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O3

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,BaseTableRef *ref)

{
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> *this_00;
  string *this_01;
  size_type *retriever;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *__y
  ;
  CatalogType CVar1;
  optional_idx error_context_p;
  CommonTableExpressionInfo *cte;
  pointer pcVar2;
  pointer pCVar3;
  pointer pbVar4;
  _Alloc_hider view;
  pointer pCVar5;
  pointer pLVar6;
  BindingMode BVar7;
  char cVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  pointer pSVar12;
  pointer pQVar13;
  optional_ptr<duckdb::BoundAtClause,_true> at_clause_p;
  idx_t iVar14;
  StatementProperties *this_02;
  undefined4 extraout_var;
  ColumnList *pCVar15;
  Binder *pBVar16;
  long *plVar17;
  reference pvVar18;
  Catalog *catalog;
  long lVar19;
  pointer this_03;
  BoundSubqueryRef *pBVar20;
  pointer pBVar21;
  undefined4 extraout_var_00;
  type subquery_00;
  DBConfig *pDVar22;
  size_t sVar23;
  __node_base_ptr index;
  string *psVar24;
  ColumnDefinition *this_04;
  LogicalType *pLVar25;
  string *psVar26;
  pointer pLVar27;
  vector<duckdb::ColumnIndex,_true> *bound_column_ids;
  undefined8 *puVar28;
  element_type *peVar29;
  mapped_type *pmVar30;
  type puVar31;
  pointer pBVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  InternalException *pIVar34;
  FileSystem *pFVar35;
  InvalidInputException *this_05;
  BinderException *pBVar36;
  idx_t iVar37;
  long in_RDX;
  pointer rhs;
  undefined8 uVar38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar39;
  ulong __n;
  string *psVar40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var41;
  size_type __n_00;
  char *pcVar42;
  ColumnListIterator CVar43;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cte_reference;
  optional_ptr<duckdb::Binding,_true> ctebinding;
  optional_ptr<duckdb::CatalogEntry,_true> table_or_view;
  mapped_type cteref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<duckdb::LogicalType,_true> return_types;
  shared_ptr<duckdb::Binder,_true> view_binder;
  unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>,_true> at_clause;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  return_names;
  optional_ptr<duckdb::TableCatalogEntry,_true> table_entry;
  idx_t table_index;
  EntryLookupInfo table_lookup;
  SubqueryRef subquery;
  undefined1 local_558 [8];
  element_type *peStack_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  float local_538;
  size_t local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_528;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  _Alloc_hider local_4f8;
  Binder *local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [3];
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_488;
  undefined1 local_468 [24];
  undefined1 local_450 [24];
  vector<duckdb::LogicalType,_true> local_438;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_418;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_410;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_408;
  vector<duckdb::LogicalType,_true> local_400;
  EntryLookupInfo local_3e8;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  __node_base local_360;
  _Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
  local_358;
  optional_ptr<duckdb::SQLStatement,_true> local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_208 [32];
  undefined1 local_1e8 [32];
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  _Any_data local_188;
  __node_base local_178;
  _Any_data local_170;
  undefined1 local_160 [16];
  undefined1 local_150 [32];
  string local_130;
  undefined1 local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  char local_c0 [16];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [32];
  
  error_context_p.index = ((optional_idx *)(in_RDX + 0x38))->index;
  psVar26 = (string *)(in_RDX + 0x88);
  if ((*(long *)(in_RDX + 0x90) == 0) ||
     (iVar11 = ::std::__cxx11::string::compare((char *)psVar26), iVar11 == 0)) {
    psVar40 = (string *)(in_RDX + 0xa8);
    sVar23 = *(size_t *)(in_RDX + 0xb0);
    if (sVar23 == *(size_t *)((long)&ref[1].table_name.field_2 + 8)) {
      if (sVar23 == 0) {
        bVar9 = true;
      }
      else {
        iVar11 = bcmp((psVar40->_M_dataplus)._M_p,
                      (void *)ref[1].table_name.field_2._M_allocated_capacity,sVar23);
        bVar9 = iVar11 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    FindCTE((vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> *)local_3c0,
            (Binder *)ref,psVar40,bVar9);
    local_500 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._0_8_;
    if (local_3c0._0_8_ != local_3c0._8_8_) {
      this_01 = &ref->schema_name;
      paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._0_8_;
      do {
        cte = (CommonTableExpressionInfo *)paVar39->_M_allocated_capacity;
        local_518.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)BindContext::GetCTEBinding((BindContext *)this_01,psVar40);
        if ((Binding *)
            local_518.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (Binding *)0x0) {
          pSVar12 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                    ::operator->(&cte->query);
          pQVar13 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                    operator->(&pSVar12->node);
          if ((pQVar13->type == RECURSIVE_CTE_NODE) || (cte->materialized == CTE_MATERIALIZE_ALWAYS)
             ) {
            index = (__node_base_ptr)GenerateTableIndex((Binder *)ref);
            cVar10 = (char)*(undefined4 *)&cte->materialized;
            cVar8 = '\x03';
            if (cVar10 != '\x01') {
              cVar8 = cVar10;
            }
            iVar11 = ::std::__cxx11::string::compare((char *)psVar26);
            if ((iVar11 == 0) &&
               ((cte->key_targets).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (cte->key_targets).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
              this_05 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_3c0._0_8_ = local_3c0 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3c0,
                         "RECURRING can only be used with USING KEY in recursive CTE.","");
              InvalidInputException::InvalidInputException(this_05,(string *)local_3c0);
              __cxa_throw(this_05,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            optional_ptr<duckdb::Binding,_true>::CheckValid
                      ((optional_ptr<duckdb::Binding,_true> *)&local_518);
            pbVar4 = local_518.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar11 = ::std::__cxx11::string::compare((char *)psVar26);
            local_488.
            super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x60);
            iVar14 = *(idx_t *)((long)pbVar4 + 0x70);
            *(undefined1 *)
             &(((element_type *)
               local_488.
               super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 7;
            ((element_type *)
            local_488.
            super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
            ._M_impl.super__Vector_impl_data._M_start)->context = (ClientContext *)0x0;
            (((element_type *)
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&PTR__BoundCTERef_02436850;
            (((element_type *)
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start)->CTE_bindings)._M_h._M_buckets =
                 (__buckets_ptr)0x0;
            (((element_type *)
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start)->CTE_bindings)._M_h._M_bucket_count = 0;
            (((element_type *)
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start)->CTE_bindings)._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)0x0;
            (((element_type *)
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start)->CTE_bindings)._M_h._M_element_count = 0;
            *(undefined8 *)
             &(((element_type *)
               local_488.
               super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->CTE_bindings)._M_h._M_rehash_policy = 0;
            (((element_type *)
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start)->CTE_bindings)._M_h._M_rehash_policy.
            _M_next_resize = 0;
            (((element_type *)
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start)->CTE_bindings)._M_h._M_single_bucket = index
            ;
            *(idx_t *)&(((element_type *)
                        local_488.
                        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bound_ctes)._M_h = iVar14;
            *(char *)&(((element_type *)
                       local_488.
                       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start)->bound_ctes)._M_h._M_bucket_count
                 = cVar8;
            *(bool *)((long)&(((element_type *)
                              local_488.
                              super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bound_ctes)._M_h.
                             _M_bucket_count + 1) = iVar11 == 0;
            psVar24 = (string *)(in_RDX + 0x10);
            if (*(long *)(in_RDX + 0x18) == 0) {
              psVar24 = psVar40;
            }
            pcVar2 = (psVar24->_M_dataplus)._M_p;
            local_3c0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_3c0 + 0x10);
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3c0,pcVar2,pcVar2 + psVar24->_M_string_length);
            optional_ptr<duckdb::Binding,_true>::CheckValid
                      ((optional_ptr<duckdb::Binding,_true> *)&local_518);
            BindContext::AliasColumnNames
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&local_3e8,(string *)local_3c0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)((long)local_518.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 0x90),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)(in_RDX + 0x50));
            optional_ptr<duckdb::Binding,_true>::CheckValid
                      ((optional_ptr<duckdb::Binding,_true> *)&local_518);
            BindContext::AddGenericBinding
                      ((BindContext *)this_01,(idx_t)index,(string *)local_3c0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&local_3e8,
                       (vector<duckdb::LogicalType,_true> *)
                       ((long)local_518.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x78));
            if (*(long *)(in_RDX + 0x90) == 0) {
              local_558 = (undefined1  [8])&local_548;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_558,*(long *)(in_RDX + 0xa8),
                         *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
            }
            else {
              pcVar2 = (psVar26->_M_dataplus)._M_p;
              local_4c8._M_allocated_capacity = (size_type)local_4b8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4c8,pcVar2,pcVar2 + *(long *)(in_RDX + 0x90));
              ::std::__cxx11::string::append(local_4c8._M_local_buf);
              puVar28 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  (local_4c8._M_local_buf,*(ulong *)(in_RDX + 0xa8));
              local_558 = (undefined1  [8])&local_548;
              paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar28 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar28 == paVar39) {
                local_548._M_allocated_capacity = paVar39->_M_allocated_capacity;
                local_548._8_8_ = puVar28[3];
              }
              else {
                local_548._M_allocated_capacity = paVar39->_M_allocated_capacity;
                local_558 = (undefined1  [8])*puVar28;
              }
              peStack_550 = (element_type *)puVar28[1];
              *puVar28 = paVar39;
              puVar28[1] = 0;
              *(undefined1 *)(puVar28 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_allocated_capacity != local_4b8) {
                operator_delete((void *)local_4c8._M_allocated_capacity);
              }
            }
            pmVar30 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_01,(key_type *)local_558);
            local_4e8._M_allocated_capacity =
                 (size_type)
                 (pmVar30->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            local_4e8._8_8_ =
                 (pmVar30->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_)->_M_use_count
                     + 1;
              }
            }
            if (((element_type *)local_4e8._M_allocated_capacity == (element_type *)0x0) &&
               (iVar11 = ::std::__cxx11::string::compare((char *)psVar26), iVar11 == 0)) {
              pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
              local_4c8._M_allocated_capacity = (size_type)local_4b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4c8,
                         "There is a WITH item named \"%s\", but the recurring table cannot be referenced from this part of the query."
                         ,"");
              local_50._0_8_ = local_50 + 0x10;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_50,*(long *)(in_RDX + 0xa8),
                         *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
              BinderException::BinderException<std::__cxx11::string>
                        (pBVar36,(string *)&local_4c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
              __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            puVar31 = shared_ptr<unsigned_long,_true>::operator*
                                ((shared_ptr<unsigned_long,_true> *)&local_4e8);
            *puVar31 = *puVar31 + 1;
            optional_ptr<duckdb::Binding,_true>::CheckValid
                      ((optional_ptr<duckdb::Binding,_true> *)&local_518);
            pbVar4 = local_518.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pBVar32 = unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                      ::operator->((unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                                    *)&local_488);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &pBVar32->types,
                       (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       ((long)pbVar4 + 0x78));
            pBVar32 = unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                      ::operator->((unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                                    *)&local_488);
            local_4b8[0]._0_8_ =
                 (pBVar32->bound_columns).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pBVar32->bound_columns).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = &(local_3e8.at_clause.ptr)->unit;
            local_4c8._M_allocated_capacity =
                 (size_type)
                 (pBVar32->bound_columns).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_4c8._8_8_ =
                 (pBVar32->bound_columns).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (pBVar32->bound_columns).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3e8._0_8_;
            (pBVar32->bound_columns).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = local_3e8.name;
            local_3e8._0_8_ = (pointer)0x0;
            local_3e8.name = (pointer)0x0;
            local_3e8.at_clause.ptr = (BoundAtClause *)0x0;
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4c8._M_local_buf);
            pCVar5 = local_488.
                     super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_488.
            super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pCVar5;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_);
            }
            if (local_558 != (undefined1  [8])&local_548) {
              operator_delete((void *)local_558);
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_3e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_3c0 + 0x10)) {
              operator_delete((void *)local_3c0._0_8_);
            }
            if (local_488.
                super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)(((local_488.
                             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start)->catalog)._M_dataplus._M_p +
                          8))();
            }
            goto LAB_00dd25d4;
          }
        }
        bVar9 = CTEIsAlreadyBound((Binder *)ref,cte);
        if (!bVar9) {
          if (cte->materialized == CTE_MATERIALIZE_ALWAYS) {
            pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
            local_3c0._0_8_ = local_3c0 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3c0,
                       "There is a WITH item named \"%s\", but it cannot be referenced from this part of the query."
                       ,"");
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,*(long *)(in_RDX + 0xa8),
                       *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar36,(string *)local_3c0,&local_70);
            __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          iVar11 = ::std::__cxx11::string::compare((char *)psVar26);
          if (iVar11 == 0) {
            pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
            local_3c0._0_8_ = local_3c0 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3c0,
                       "There is a WITH item named \"%s\", but the recurring table cannot be referenced from this part of the query."
                       ,"");
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,*(long *)(in_RDX + 0xa8),
                       *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar36,(string *)local_3c0,&local_90);
            __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pSVar12 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                    ::operator->(&cte->query);
          (*(pSVar12->super_SQLStatement)._vptr_SQLStatement[3])(local_450 + 8,pSVar12);
          local_408._M_head_impl = (SelectStatement *)local_450._8_8_;
          local_450._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          SubqueryRef::SubqueryRef
                    ((SubqueryRef *)local_3c0,
                     (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      *)&local_408,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if (local_408._M_head_impl != (SelectStatement *)0x0) {
            (*((local_408._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
          }
          local_408._M_head_impl = (SelectStatement *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_450._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            (*(*(_func_int ***)local_450._8_8_)[1])();
          }
          local_450._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ::std::__cxx11::string::_M_assign((string *)(local_3c0 + 0x10));
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_370._M_local_buf,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)cte);
          if (*(long *)(in_RDX + 0x58) != *(long *)(in_RDX + 0x50)) {
            __n = 0;
            do {
              if (__n < (ulong)((long)(local_370._8_8_ - local_370._0_8_) >> 5)) {
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)(in_RDX + 0x50),__n);
                pvVar18 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        *)&local_370,__n);
                ::std::__cxx11::string::_M_assign((string *)pvVar18);
              }
              else {
                pvVar18 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        *)(in_RDX + 0x50),__n);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_370._M_local_buf,pvVar18);
              }
              __n = __n + 1;
            } while (__n < (ulong)(*(long *)(in_RDX + 0x58) - *(long *)(in_RDX + 0x50) >> 5));
          }
          Bind(this,(SubqueryRef *)ref,(CommonTableExpressionInfo *)local_3c0);
          local_3c0._0_8_ = &PTR__SubqueryRef_0243bfd8;
          if (local_358.super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl !=
              (SelectStatement *)0x0) {
            (**(code **)(*(long *)local_358.super__Head_base<0UL,_duckdb::SelectStatement_*,_false>.
                                  _M_head_impl + 8))();
          }
          local_358.super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
               (_Head_base<0UL,_duckdb::SelectStatement_*,_false>)(SelectStatement *)0x0;
          TableRef::~TableRef((TableRef *)local_3c0);
          goto LAB_00dd25d4;
        }
        paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar39->_M_local_buf + 8);
      } while (paVar39 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3c0._8_8_);
      BindWithReplacementScan
                (this,(ClientContext *)ref,
                 (BaseTableRef *)(ref->super_TableRef).alias._M_dataplus._M_p);
      if ((this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
         ) {
        pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
        local_3c0._0_8_ = local_3c0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c0,
                   "Circular reference to CTE \"%s\", There are two possible solutions. \n1. use WITH RECURSIVE to use recursive CTEs. \n2. If you want to use the TABLE name \"%s\" the same as the CTE name, please explicitly add \"SCHEMA\" before table name. You can try \"main.%s\" (main is the duckdb default schema)"
                   ,"");
        local_d0._M_allocated_capacity = (size_type)local_c0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,*(long *)(in_RDX + 0xa8),
                   *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,*(long *)(in_RDX + 0xa8),
                   *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,*(long *)(in_RDX + 0xa8),
                   *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (pBVar36,(string *)local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                   &local_f0,&local_1a8);
        __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_00dd25d4;
    }
  }
  else {
    local_500 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  }
  BindAtClause((Binder *)local_450,(optional_ptr<duckdb::AtClause,_true>)ref);
  at_clause_p.ptr = (BoundAtClause *)local_450._0_8_;
  if ((element_type *)local_450._0_8_ == (element_type *)0x0) {
    at_clause_p = CatalogEntryRetriever::GetAtClause
                            ((CatalogEntryRetriever *)&ref[3].catalog_name._M_string_length);
  }
  local_4f0 = (Binder *)(in_RDX + 0xa8);
  EntryLookupInfo::EntryLookupInfo
            (&local_3e8,TABLE_ENTRY,(string *)local_4f0,at_clause_p,
             (QueryErrorContext)error_context_p.index);
  retriever = &ref[3].catalog_name._M_string_length;
  psVar40 = (string *)(in_RDX + 0x68);
  BindSchemaOrCatalog((CatalogEntryRetriever *)retriever,psVar40,psVar26);
  local_4f8._M_p =
       (pointer)CatalogEntryRetriever::GetEntry
                          ((CatalogEntryRetriever *)retriever,psVar40,psVar26,&local_3e8,RETURN_NULL
                          );
  BVar7 = GetBindingMode((Binder *)ref);
  if (BVar7 == EXTRACT_NAMES) {
    if (((ClientContext *)local_4f8._M_p == (ClientContext *)0x0) ||
       (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_4f8),
       *(CatalogType *)
        &(((shared_ptr<duckdb::DatabaseInstance,_true> *)(local_4f8._M_p + 0x10))->internal).
         super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       TABLE_ENTRY)) {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,*(long *)(in_RDX + 0xa8),
                 *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
      AddTableName((Binder *)ref,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      iVar14 = GenerateTableIndex((Binder *)ref);
      pBVar16 = (Binder *)(in_RDX + 0x10);
      if (*(long *)(in_RDX + 0x18) == 0) {
        pBVar16 = local_4f0;
      }
      peVar29 = (pBVar16->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_3c0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_3c0 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_3c0,peVar29,
                 (pointer)((long)&((pBVar16->super_enable_shared_from_this<duckdb::Binder>).
                                   __weak_this_.internal.
                                   super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar29));
      LogicalType::LogicalType((LogicalType *)local_558,INTEGER);
      __l._M_len = 1;
      __l._M_array = (iterator)local_558;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 local_4e8._M_local_buf,__l,(allocator_type *)local_4c8._M_local_buf);
      LogicalType::~LogicalType((LogicalType *)local_558);
      cVar8 = '\x01';
      if (9 < iVar14) {
        iVar37 = iVar14;
        cVar10 = '\x04';
        do {
          cVar8 = cVar10;
          if (iVar37 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_00dd2466;
          }
          if (iVar37 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_00dd2466;
          }
          if (iVar37 < 10000) goto LAB_00dd2466;
          bVar9 = 99999 < iVar37;
          iVar37 = iVar37 / 10000;
          cVar10 = cVar8 + '\x04';
        } while (bVar9);
        cVar8 = cVar8 + '\x01';
      }
LAB_00dd2466:
      local_4c8._M_allocated_capacity = (size_type)local_4b8;
      ::std::__cxx11::string::_M_construct((ulong)&local_4c8,cVar8);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_4c8._M_allocated_capacity,local_4c8._8_4_,iVar14);
      puVar28 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_4c8,0,(char *)0x0,0x1d8c87f);
      paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar28 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar28 == paVar39) {
        local_548._M_allocated_capacity = paVar39->_M_allocated_capacity;
        local_548._8_8_ = puVar28[3];
        local_558 = (undefined1  [8])&local_548;
      }
      else {
        local_548._M_allocated_capacity = paVar39->_M_allocated_capacity;
        local_558 = (undefined1  [8])*puVar28;
      }
      peStack_550 = (element_type *)puVar28[1];
      *puVar28 = paVar39;
      puVar28[1] = 0;
      *(undefined1 *)(puVar28 + 2) = 0;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_558;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_518,__l_00,(allocator_type *)&local_488);
      if (local_558 != (undefined1  [8])&local_548) {
        operator_delete((void *)local_558);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_allocated_capacity != local_4b8) {
        operator_delete((void *)local_4c8._M_allocated_capacity);
      }
      BindContext::AddGenericBinding
                ((BindContext *)&ref->schema_name,iVar14,(string *)local_3c0,&local_518,
                 (vector<duckdb::LogicalType,_true> *)&local_4e8);
      peVar29 = (element_type *)operator_new(0x20);
      *(undefined1 *)
       &(peVar29->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 8;
      peVar29->context = (ClientContext *)0x0;
      *(undefined ***)&(peVar29->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ =
           &PTR__BoundTableRef_02436888;
      (peVar29->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)iVar14;
      (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar29;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_518);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 local_4e8._M_local_buf);
      uVar38 = local_3c0._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_3c0 + 0x10)) {
LAB_00dd25b5:
        operator_delete((void *)uVar38);
      }
    }
    else {
LAB_00dd14f8:
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_4f8);
      CVar1 = *(CatalogType *)
               &(((shared_ptr<duckdb::DatabaseInstance,_true> *)(local_4f8._M_p + 0x10))->internal).
                super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (CVar1 == VIEW_ENTRY) {
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_4f8);
        view._M_p = local_4f8._M_p;
        CreateBinder((Binder *)local_468,
                     (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p,
                     (optional_ptr<duckdb::Binder,_true>)ref,VIEW_BINDER);
        pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_468);
        pBVar16->can_contain_nulls = true;
        plVar17 = (long *)(**(code **)(*(long *)view._M_p + 0x80))(view._M_p);
        (**(code **)(*plVar17 + 0x18))(local_468 + 0x10,plVar17);
        local_418._M_head_impl = (SelectStatement *)local_468._16_8_;
        local_468._16_8_ = (ClientContext *)0x0;
        local_130._M_string_length = 0;
        local_130.field_2._M_local_buf[0] = '\0';
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        SubqueryRef::SubqueryRef
                  ((SubqueryRef *)local_3c0,
                   (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                    *)&local_418,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((ClientContext *)local_418._M_head_impl != (ClientContext *)0x0) {
          (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                       &((local_418._M_head_impl)->super_SQLStatement)._vptr_SQLStatement)->internal
                      ).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
        local_418._M_head_impl = (SelectStatement *)0x0;
        if ((ClientContext *)local_468._16_8_ != (ClientContext *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_468._16_8_)->
                      __weak_this_).internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
        local_468._16_8_ = (ClientContext *)0x0;
        ::std::__cxx11::string::_M_assign((string *)(local_3c0 + 0x10));
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_518,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(view._M_p + 0x148));
        __y = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)(view._M_p + 0x178);
        if ((ulong)((long)local_518.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_518.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) <
            (ulong)((long)*(pointer *)(view._M_p + 0x180) -
                   (long)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)(view._M_p + 0x178))->
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
          __n_00 = (long)local_518.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_518.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          do {
            pvVar18 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](__y,__n_00);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_518,pvVar18);
            __n_00 = __n_00 + 1;
          } while (__n_00 < (ulong)((long)*(pointer *)(view._M_p + 0x180) -
                                    (long)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                             *)(view._M_p + 0x178))->
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        pBVar16 = local_4f0;
        BindContext::AliasColumnNames
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&local_4c8,(string *)local_4f0,&local_518,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)(in_RDX + 0x50));
        local_548._M_allocated_capacity = (size_type)local_360._M_nxt;
        peStack_550 = (element_type *)local_370._8_8_;
        local_558 = (undefined1  [8])local_370._M_allocated_capacity;
        local_360._M_nxt = (_Hash_node_base *)local_4b8[0]._0_8_;
        local_370._M_allocated_capacity = local_4c8._M_allocated_capacity;
        local_370._8_8_ = local_4c8._8_8_;
        local_4c8._M_allocated_capacity = 0;
        local_4c8._8_8_ = (element_type *)0x0;
        local_4b8[0]._M_allocated_capacity = (pointer)0x0;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_558);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_4c8._M_local_buf);
        catalog = (Catalog *)(**(code **)(*(long *)view._M_p + 0x58))(view._M_p);
        lVar19 = (**(code **)(*(long *)view._M_p + 0x68))(view._M_p);
        GetSearchPath((vector<duckdb::CatalogSearchEntry,_true> *)&local_488,pBVar16,catalog,
                      (string *)(lVar19 + 0x20));
        pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_468);
        local_188._M_unused._M_object =
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_188._8_8_ =
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_178._M_nxt =
             (_Hash_node_base *)
             local_488.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_488.
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_488.
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_488.
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        CatalogEntryRetriever::SetSearchPath
                  (&pBVar16->entry_retriever,(vector<duckdb::CatalogSearchEntry,_true> *)&local_188)
        ;
        ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
        ~vector((vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> *)
                &local_188);
        pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_468);
        CatalogEntryRetriever::SetAtClause(&pBVar16->entry_retriever,at_clause_p);
        pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_468);
        AddBoundView(pBVar16,(ViewCatalogEntry *)view._M_p);
        pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_468);
        Bind(this,(SubqueryRef *)pBVar16,(CommonTableExpressionInfo *)local_3c0);
        pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_468);
        if ((pBVar16->correlated_columns).
            super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            .
            super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pBVar16->correlated_columns).
            super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            .
            super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
          local_558 = (undefined1  [8])&local_548;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_558,
                     "Contents of view were altered - view bound correlated columns","");
          BinderException::BinderException(pBVar36,(string *)local_558);
          __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        this_03 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                  ::operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                                *)this);
        pBVar20 = BoundTableRef::Cast<duckdb::BoundSubqueryRef>(this_03);
        BVar7 = GetBindingMode((Binder *)ref);
        if ((BVar7 != EXTRACT_NAMES) &&
           (cVar8 = (**(code **)(*(long *)view._M_p + 0x88))(view._M_p), cVar8 != '\0')) {
          this_00 = &pBVar20->subquery;
          pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                    ::operator->(this_00);
          ExchangeAllNullTypes(&local_438,&pBVar21->types);
          ExchangeAllNullTypes(&local_400,(vector<duckdb::LogicalType,_true> *)(view._M_p + 0x160));
          pLVar6 = local_438.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                   .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if ((long)local_438.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_438.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
              (long)local_400.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_400.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
LAB_00dd2be7:
            local_4c8._M_allocated_capacity = (size_type)local_4b8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,", ","");
            StringUtil::ToString<duckdb::LogicalType>
                      ((string *)local_558,&local_438,(string *)&local_4c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_allocated_capacity != local_4b8) {
              operator_delete((void *)local_4c8._M_allocated_capacity);
            }
            local_4e8._M_allocated_capacity = (size_type)&local_4d8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,", ","");
            StringUtil::ToString<duckdb::LogicalType>
                      ((string *)&local_4c8,&local_400,(string *)&local_4e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_allocated_capacity != &local_4d8) {
              operator_delete((void *)local_4e8._M_allocated_capacity);
            }
            pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
            local_4e8._M_allocated_capacity = (size_type)&local_4d8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4e8,
                       "Contents of view were altered: types don\'t match! Expected [%s], but found [%s] instead"
                       ,"");
            local_150._0_8_ = local_150 + 0x10;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_150,local_4c8._M_allocated_capacity,
                       (undefined1 *)(local_4c8._8_8_ + local_4c8._M_allocated_capacity));
            local_1e8._0_8_ = local_1e8 + 0x10;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1e8,local_558,
                       (pointer)((long)&((_Alloc_hider *)&peStack_550->_vptr_ExtraTypeInfo)->_M_p +
                                (long)local_558));
            BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                      (pBVar36,(string *)&local_4e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e8);
            __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          rhs = local_400.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
          pLVar25 = local_438.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (local_438.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_438.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              bVar9 = LogicalType::operator==(pLVar25,rhs);
              pLVar25 = pLVar25 + 1;
              rhs = rhs + 1;
            } while (bVar9 && pLVar25 != pLVar6);
            if (!bVar9) goto LAB_00dd2be7;
          }
          pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                    ::operator->(this_00);
          if ((long)(pBVar21->names).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pBVar21->names).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
              (long)*(pointer *)(view._M_p + 0x180) -
              (long)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       *)(view._M_p + 0x178))->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
            pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                      ::operator->(this_00);
            bVar9 = ::std::operator!=(&(pBVar21->names).
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)__y);
            if (bVar9) {
              pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                        ::operator->(this_00);
              local_4c8._M_allocated_capacity = (size_type)local_4b8;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,", ","");
              StringUtil::Join((string *)local_558,&pBVar21->names,(string *)&local_4c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_allocated_capacity != local_4b8) {
                operator_delete((void *)local_4c8._M_allocated_capacity);
              }
              local_4e8._M_allocated_capacity = (size_type)&local_4d8;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,", ","");
              StringUtil::Join((string *)&local_4c8,__y,(string *)&local_4e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_allocated_capacity != &local_4d8) {
                operator_delete((void *)local_4e8._M_allocated_capacity);
              }
              pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
              local_4e8._M_allocated_capacity = (size_type)&local_4d8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4e8,
                         "Contents of view were altered: names don\'t match! Expected [%s], but found [%s] instead"
                         ,"");
              local_170._M_unused._M_object = local_160;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_170,local_4c8._M_allocated_capacity,
                         (undefined1 *)(local_4c8._8_8_ + local_4c8._M_allocated_capacity));
              local_208._0_8_ = local_208 + 0x10;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_208,local_558,
                         (pointer)((long)&((_Alloc_hider *)&peStack_550->_vptr_ExtraTypeInfo)->_M_p
                                  + (long)local_558));
              BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                        (pBVar36,(string *)&local_4e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_170,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
              __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_400
                    );
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_438
                    );
        }
        pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                  ::operator->(&pBVar20->subquery);
        iVar11 = (*pBVar21->_vptr_BoundQueryNode[2])(pBVar21);
        subquery_00 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                      ::operator*(&pBVar20->subquery);
        BindContext::AddView
                  ((BindContext *)&ref->schema_name,CONCAT44(extraout_var_00,iVar11),
                   (string *)(local_3c0 + 0x10),(SubqueryRef *)local_3c0,subquery_00,
                   (ViewCatalogEntry *)view._M_p);
        ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
        ~vector(&local_488);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_518);
        local_3c0._0_8_ = &PTR__SubqueryRef_0243bfd8;
        if (local_358.super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl !=
            (SelectStatement *)0x0) {
          (**(code **)(*(long *)local_358.super__Head_base<0UL,_duckdb::SelectStatement_*,_false>.
                                _M_head_impl + 8))();
        }
        local_358.super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::SelectStatement_*,_false>)(SelectStatement *)0x0;
        TableRef::~TableRef((TableRef *)local_3c0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_);
        }
      }
      else {
        if (CVar1 != TABLE_ENTRY) {
          pIVar34 = (InternalException *)__cxa_allocate_exception(0x10);
          local_3c0._0_8_ = local_3c0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3c0,"Catalog entry type","");
          InternalException::InternalException(pIVar34,(string *)local_3c0);
          __cxa_throw(pIVar34,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_400.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)GenerateTableIndex((Binder *)ref);
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_4f8);
        local_450._16_8_ = local_4f8._M_p;
        this_02 = GetStatementProperties((Binder *)ref);
        iVar11 = (*(((StandardEntry *)local_450._16_8_)->super_InCatalogEntry).super_CatalogEntry.
                   _vptr_CatalogEntry[0xb])();
        StatementProperties::RegisterDBRead
                  (this_02,(Catalog *)CONCAT44(extraout_var,iVar11),
                   (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p);
        uVar38 = local_450._16_8_;
        local_468._0_8_ =
             (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)0x0;
        (*(((StandardEntry *)local_450._16_8_)->super_InCatalogEntry).super_CatalogEntry.
          _vptr_CatalogEntry[0x14])
                  (local_3c0,local_450._16_8_,(ref->super_TableRef).alias._M_dataplus._M_p,local_468
                   ,&local_3e8);
        local_4e8._M_allocated_capacity = 0;
        local_4e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4d8._M_allocated_capacity = 0;
        local_518.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_518.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_518.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_488.
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_488.
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_488.
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_438.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start = (LogicalType *)0x0;
        local_438.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish = (LogicalType *)0x0;
        pCVar15 = TableCatalogEntry::GetColumns((TableCatalogEntry *)uVar38);
        CVar43 = ColumnList::Logical(pCVar15);
        pCVar15 = CVar43.list;
        if (((undefined1  [16])CVar43 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pCVar3 = (pCVar15->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_548._8_8_ =
               ((long)pCVar3 -
                (long)(pCVar15->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
          p_Var41 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((long)pCVar3 -
                      (long)(pCVar15->columns).
                            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            .
                            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
        }
        else {
          p_Var41 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)(pCVar15->physical_columns).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(pCVar15->physical_columns).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3);
          local_548._8_8_ = p_Var41;
        }
        local_548._M_allocated_capacity = 0;
        peStack_550 = (element_type *)CONCAT71(peStack_550._1_7_,CVar43.physical);
        local_558 = (undefined1  [8])pCVar15;
        while ((((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._M_allocated_capacity !=
                 p_Var41 ||
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._8_8_ != p_Var41)) ||
               (local_558 != (undefined1  [8])pCVar15))) {
          this_04 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                              ((ColumnLogicalIteratorInternal *)local_558);
          pLVar25 = ColumnDefinition::Type(this_04);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                     local_4e8._M_local_buf,pLVar25);
          psVar26 = ColumnDefinition::Name_abi_cxx11_(this_04);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_518,psVar26);
          pLVar25 = ColumnDefinition::Type(this_04);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_488
                     ,pLVar25);
          psVar26 = ColumnDefinition::Name_abi_cxx11_(this_04);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_438,psVar26);
          local_548._M_allocated_capacity = local_548._M_allocated_capacity + 1;
        }
        BindContext::AliasColumnNames
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&local_4c8,(string *)local_4f0,&local_518,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)(in_RDX + 0x50));
        local_548._M_allocated_capacity =
             (size_type)
             local_518.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        peStack_550 = (element_type *)
                      local_518.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_558 = (undefined1  [8])
                    local_518.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_518.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4b8[0]._0_8_;
        local_518.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4c8._M_allocated_capacity;
        local_518.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4c8._8_8_;
        local_4c8._M_allocated_capacity = 0;
        local_4c8._8_8_ = (element_type *)0x0;
        local_4b8[0]._M_allocated_capacity = (pointer)0x0;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_558);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_4c8._M_local_buf);
        local_558 = (undefined1  [8])&aStack_528;
        peStack_550 = (element_type *)&DAT_00000001;
        local_548._M_allocated_capacity = 0;
        local_548._8_8_ = 0;
        local_538 = 1.0;
        local_530 = 0;
        aStack_528._M_allocated_capacity = 0;
        if (local_240.ptr == (SQLStatement *)0x0) {
          (*(((StandardEntry *)local_450._16_8_)->super_InCatalogEntry).super_CatalogEntry.
            _vptr_CatalogEntry[0x19])(&local_4c8);
          ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_move_assign((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)local_558,&local_4c8);
        }
        else {
          (*(code *)local_240.ptr)
                    (&local_4c8,(ref->super_TableRef).alias._M_dataplus._M_p,local_468._0_8_);
          ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_move_assign((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)local_558,&local_4c8);
        }
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_4c8);
        make_uniq<duckdb::LogicalGet,unsigned_long&,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>,duckdb::vector<std::__cxx11::string,true>,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>>
                  ((duckdb *)local_4c8._M_local_buf,(unsigned_long *)&local_400,
                   (TableFunction *)local_3c0,
                   (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                    *)local_468,(vector<duckdb::LogicalType,_true> *)&local_488,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&local_438,
                   (unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                    *)local_558);
        pLVar27 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                  operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                              *)&local_4c8._M_allocated_capacity);
        local_410 = LogicalGet::GetTable(pLVar27);
        pLVar27 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                  operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                              *)&local_4c8._M_allocated_capacity);
        bound_column_ids = LogicalGet::GetMutableColumnIds(pLVar27);
        pLVar6 = local_400.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (local_410.ptr == (TableCatalogEntry *)0x0) {
          BindContext::AddBaseTable
                    ((BindContext *)&ref->schema_name,
                     (idx_t)local_400.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start,(string *)(in_RDX + 0x10),
                     &local_518,(vector<duckdb::LogicalType,_true> *)&local_4e8,bound_column_ids,
                     (string *)local_4f0);
        }
        else {
          optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_410);
          BindContext::AddBaseTable
                    ((BindContext *)&ref->schema_name,(idx_t)pLVar6,(string *)(in_RDX + 0x10),
                     &local_518,(vector<duckdb::LogicalType,_true> *)&local_4e8,bound_column_ids,
                     local_410.ptr,true);
        }
        peVar29 = (element_type *)operator_new(0x28);
        *(undefined1 *)
         &(peVar29->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 1;
        peVar29->context = (ClientContext *)0x0;
        *(undefined ***)&(peVar29->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ =
             &PTR__BoundBaseTableRef_024368c0;
        (peVar29->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)local_450._16_8_;
        (peVar29->CTE_bindings)._M_h._M_bucket_count = local_4c8._M_allocated_capacity;
        (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar29;
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_558);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_438);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_488);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_518);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   local_4e8._M_local_buf);
        local_3c0._0_8_ = &PTR__TableFunction_02435168;
        if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
        }
        SimpleNamedParameterFunction::~SimpleNamedParameterFunction
                  ((SimpleNamedParameterFunction *)local_3c0);
        if ((element_type *)local_468._0_8_ != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_468._0_8_)->__weak_this_).
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
      }
    }
  }
  else {
    if ((ClientContext *)local_4f8._M_p != (ClientContext *)0x0) goto LAB_00dd14f8;
    BindWithReplacementScan
              (this,(ClientContext *)ref,
               (BaseTableRef *)(ref->super_TableRef).alias._M_dataplus._M_p);
    if ((this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
    {
      ReplacementScan::GetFullPath((string *)&local_4c8,psVar40,psVar26,(string *)local_4f0);
      pBVar16 = (Binder *)(ref->super_TableRef).alias._M_dataplus._M_p;
      StringUtil::Lower((string *)local_3c0,(string *)&local_4c8);
      pDVar22 = DBConfig::GetConfig((ClientContext *)pBVar16);
      if ((pDVar22->options).autoload_known_extensions == true) {
        pcVar42 = ".parquet";
        lVar19 = 0;
        local_4f0 = pBVar16;
        do {
          local_558 = (undefined1  [8])&local_548;
          sVar23 = strlen(pcVar42);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_558,pcVar42,pcVar42 + sVar23);
          bVar9 = StringUtil::EndsWith((string *)local_3c0,(string *)local_558);
          if (local_558 != (undefined1  [8])&local_548) {
            operator_delete((void *)local_558);
          }
          if (bVar9) {
            local_558 = (undefined1  [8])&local_548;
            sVar23 = strlen("parquet" + -lVar19);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_558,"parquet" + -lVar19,"parquet" + sVar23 + -lVar19);
            ExtensionHelper::AutoLoadExtension((ClientContext *)local_4f0,(string *)local_558);
            goto LAB_00dd2835;
          }
          lVar19 = lVar19 + -0x60;
          pcVar42 = pcVar42 + 0x60;
        } while (lVar19 != -0x300);
        pcVar42 = ".parquet?";
        lVar19 = 0;
LAB_00dd1e16:
        local_558 = (undefined1  [8])&local_548;
        sVar23 = strlen(pcVar42);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_558,pcVar42,pcVar42 + sVar23);
        bVar9 = StringUtil::Contains((string *)local_3c0,(string *)local_558);
        if (local_558 != (undefined1  [8])&local_548) {
          operator_delete((void *)local_558);
        }
        if (!bVar9) goto code_r0x00dd1e66;
        local_558 = (undefined1  [8])&local_548;
        sVar23 = strlen("parquet" + -lVar19);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_558,"parquet" + -lVar19,"parquet" + sVar23 + -lVar19);
        ExtensionHelper::AutoLoadExtension((ClientContext *)local_4f0,(string *)local_558);
LAB_00dd2835:
        if (local_558 != (undefined1  [8])&local_548) {
          operator_delete((void *)local_558);
        }
        bVar9 = true;
        goto LAB_00dd284c;
      }
LAB_00dd1e77:
      bVar9 = false;
LAB_00dd284c:
      paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_3c0 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._0_8_ != paVar39) {
        operator_delete((void *)local_3c0._0_8_);
      }
      if (!bVar9) {
LAB_00dd2ae6:
        pDVar22 = DBConfig::GetConfig((ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p)
        ;
        if ((((ref->super_TableRef).alias._M_dataplus._M_p[0xec] == '\x01') &&
            ((pDVar22->options).enable_external_access == true)) &&
           (bVar9 = ExtensionHelper::IsFullPath((string *)&local_4c8), bVar9)) {
          pFVar35 = FileSystem::GetFileSystem
                              ((ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p);
          iVar11 = (*pFVar35->_vptr_FileSystem[0x12])(pFVar35,&local_4c8,0);
          if ((char)iVar11 != '\0') {
            pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
            local_3c0._0_8_ = paVar39;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3c0,
                       "No extension found that is capable of reading the file \"%s\"\n* If this file is a supported file format you can explicitly use the reader functions, such as read_csv, read_json or read_parquet"
                       ,"");
            local_110._0_8_ = local_110 + 0x10;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_110,local_4c8._M_allocated_capacity,
                       (undefined1 *)(local_4c8._8_8_ + local_4c8._M_allocated_capacity));
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar36,(string *)local_3c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110);
            __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        CatalogEntryRetriever::GetEntry
                  ((CatalogEntryRetriever *)retriever,psVar40,psVar26,&local_3e8,THROW_EXCEPTION);
        pIVar34 = (InternalException *)__cxa_allocate_exception(0x10);
        local_3c0._0_8_ = paVar39;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c0,"Catalog::GetEntry should have thrown an exception above","")
        ;
        InternalException::InternalException(pIVar34,(string *)local_3c0);
        __cxa_throw(pIVar34,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      BindWithReplacementScan
                ((Binder *)local_3c0,(ClientContext *)ref,
                 (BaseTableRef *)(ref->super_TableRef).alias._M_dataplus._M_p);
      paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._0_8_;
      local_3c0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      peVar29 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)paVar33;
      if (peVar29 != (element_type *)0x0) {
        (**(code **)(*(long *)&(peVar29->super_enable_shared_from_this<duckdb::Binder>).__weak_this_
                    + 8))();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_3c0._0_8_ + 8))();
        }
        paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                     super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      if (paVar33 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_00dd2ae6;
      uVar38 = local_4c8._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_allocated_capacity != local_4b8) goto LAB_00dd25b5;
    }
  }
  if ((element_type *)local_450._0_8_ != (element_type *)0x0) {
    ::std::default_delete<duckdb::BoundAtClause>::operator()
              ((default_delete<duckdb::BoundAtClause> *)local_450,(BoundAtClause *)local_450._0_8_);
  }
LAB_00dd25d4:
  if (local_500 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_500);
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
code_r0x00dd1e66:
  lVar19 = lVar19 + -0x60;
  pcVar42 = pcVar42 + 0x60;
  if (lVar19 == -0x180) goto LAB_00dd1e77;
  goto LAB_00dd1e16;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(BaseTableRef &ref) {
	QueryErrorContext error_context(ref.query_location);
	// CTEs and views are also referred to using BaseTableRefs, hence need to distinguish here
	// check if the table name refers to a CTE

	// CTE name should never be qualified (i.e. schema_name should be empty)
	// unless we want to refer to the recurring table of "using key".
	vector<reference<CommonTableExpressionInfo>> found_ctes;
	if (ref.schema_name.empty() || ref.schema_name == "recurring") {
		found_ctes = FindCTE(ref.table_name, ref.table_name == alias);
	}

	if (!found_ctes.empty()) {
		// Check if there is a CTE binding in the BindContext
		bool circular_cte = false;
		for (auto found_cte : found_ctes) {
			auto &cte = found_cte.get();
			auto ctebinding = bind_context.GetCTEBinding(ref.table_name);
			if (ctebinding && (cte.query->node->type == QueryNodeType::RECURSIVE_CTE_NODE ||
			                   cte.materialized == CTEMaterialize::CTE_MATERIALIZE_ALWAYS)) {
				// There is a CTE binding in the BindContext.
				// This can only be the case if there is a recursive CTE,
				// or a materialized CTE present.
				auto index = GenerateTableIndex();
				auto materialized = cte.materialized;
				if (materialized == CTEMaterialize::CTE_MATERIALIZE_DEFAULT) {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
					materialized = CTEMaterialize::CTE_MATERIALIZE_ALWAYS;
#else
					materialized = CTEMaterialize::CTE_MATERIALIZE_NEVER;
#endif
				}

				if (ref.schema_name == "recurring" && cte.key_targets.empty()) {
					throw InvalidInputException("RECURRING can only be used with USING KEY in recursive CTE.");
				}

				auto result =
				    make_uniq<BoundCTERef>(index, ctebinding->index, materialized, ref.schema_name == "recurring");
				auto alias = ref.alias.empty() ? ref.table_name : ref.alias;
				auto names = BindContext::AliasColumnNames(alias, ctebinding->names, ref.column_name_alias);

				bind_context.AddGenericBinding(index, alias, names, ctebinding->types);

				auto cte_reference = ref.schema_name.empty() ? ref.table_name : ref.schema_name + "." + ref.table_name;

				// Update references to CTE
				auto cteref = bind_context.cte_references[cte_reference];

				if (cteref == nullptr && ref.schema_name == "recurring") {
					throw BinderException("There is a WITH item named \"%s\", but the recurring table cannot be "
					                      "referenced from this part of the query.",
					                      ref.table_name);
				}

				(*cteref)++;

				result->types = ctebinding->types;
				result->bound_columns = std::move(names);
				return std::move(result);
			} else {
				if (CTEIsAlreadyBound(cte)) {
					// remember error state
					circular_cte = true;
					// retry with next candidate CTE
					continue;
				}

				// If we have found a materialized CTE, but no corresponding CTE binding,
				// something is wrong.
				if (cte.materialized == CTEMaterialize::CTE_MATERIALIZE_ALWAYS) {
					throw BinderException(
					    "There is a WITH item named \"%s\", but it cannot be referenced from this part of the query.",
					    ref.table_name);
				}

				if (ref.schema_name == "recurring") {
					throw BinderException("There is a WITH item named \"%s\", but the recurring table cannot be "
					                      "referenced from this part of the query.",
					                      ref.table_name);
				}

				// Move CTE to subquery and bind recursively
				SubqueryRef subquery(unique_ptr_cast<SQLStatement, SelectStatement>(cte.query->Copy()));
				subquery.alias = ref.alias.empty() ? ref.table_name : ref.alias;
				subquery.column_name_alias = cte.aliases;
				for (idx_t i = 0; i < ref.column_name_alias.size(); i++) {
					if (i < subquery.column_name_alias.size()) {
						subquery.column_name_alias[i] = ref.column_name_alias[i];
					} else {
						subquery.column_name_alias.push_back(ref.column_name_alias[i]);
					}
				}
				return Bind(subquery, &found_cte.get());
			}
		}
		if (circular_cte) {
			auto replacement_scan_bind_result = BindWithReplacementScan(context, ref);
			if (replacement_scan_bind_result) {
				return replacement_scan_bind_result;
			}

			throw BinderException(
			    "Circular reference to CTE \"%s\", There are two possible solutions. \n1. use WITH RECURSIVE to "
			    "use recursive CTEs. \n2. If "
			    "you want to use the TABLE name \"%s\" the same as the CTE name, please explicitly add "
			    "\"SCHEMA\" before table name. You can try \"main.%s\" (main is the duckdb default schema)",
			    ref.table_name, ref.table_name, ref.table_name);
		}
	}
	// not a CTE
	// extract a table or view from the catalog
	auto at_clause = BindAtClause(ref.at_clause);
	auto entry_at_clause = at_clause ? at_clause.get() : entry_retriever.GetAtClause();
	EntryLookupInfo table_lookup(CatalogType::TABLE_ENTRY, ref.table_name, entry_at_clause, error_context);
	BindSchemaOrCatalog(entry_retriever, ref.catalog_name, ref.schema_name);
	auto table_or_view =
	    entry_retriever.GetEntry(ref.catalog_name, ref.schema_name, table_lookup, OnEntryNotFound::RETURN_NULL);
	// we still didn't find the table
	if (GetBindingMode() == BindingMode::EXTRACT_NAMES) {
		if (!table_or_view || table_or_view->type == CatalogType::TABLE_ENTRY) {
			// if we are in EXTRACT_NAMES, we create a dummy table ref
			AddTableName(ref.table_name);

			// add a bind context entry
			auto table_index = GenerateTableIndex();
			auto alias = ref.alias.empty() ? ref.table_name : ref.alias;
			vector<LogicalType> types {LogicalType::INTEGER};
			vector<string> names {"__dummy_col" + to_string(table_index)};
			bind_context.AddGenericBinding(table_index, alias, names, types);
			return make_uniq_base<BoundTableRef, BoundEmptyTableRef>(table_index);
		}
	}
	if (!table_or_view) {
		// table could not be found: try to bind a replacement scan
		// Try replacement scan bind
		auto replacement_scan_bind_result = BindWithReplacementScan(context, ref);
		if (replacement_scan_bind_result) {
			return replacement_scan_bind_result;
		}

		// Try autoloading an extension, then retry the replacement scan bind
		auto full_path = ReplacementScan::GetFullPath(ref.catalog_name, ref.schema_name, ref.table_name);
		auto extension_loaded = TryLoadExtensionForReplacementScan(context, full_path);
		if (extension_loaded) {
			replacement_scan_bind_result = BindWithReplacementScan(context, ref);
			if (replacement_scan_bind_result) {
				return replacement_scan_bind_result;
			}
		}
		auto &config = DBConfig::GetConfig(context);
		if (context.config.use_replacement_scans && config.options.enable_external_access &&
		    ExtensionHelper::IsFullPath(full_path)) {
			auto &fs = FileSystem::GetFileSystem(context);
			if (fs.FileExists(full_path)) {
				throw BinderException(
				    "No extension found that is capable of reading the file \"%s\"\n* If this file is a supported file "
				    "format you can explicitly use the reader functions, such as read_csv, read_json or read_parquet",
				    full_path);
			}
		}

		// could not find an alternative: bind again to get the error
		(void)entry_retriever.GetEntry(ref.catalog_name, ref.schema_name, table_lookup,
		                               OnEntryNotFound::THROW_EXCEPTION);
		throw InternalException("Catalog::GetEntry should have thrown an exception above");
	}

	switch (table_or_view->type) {
	case CatalogType::TABLE_ENTRY: {
		// base table: create the BoundBaseTableRef node
		auto table_index = GenerateTableIndex();
		auto &table = table_or_view->Cast<TableCatalogEntry>();

		auto &properties = GetStatementProperties();
		properties.RegisterDBRead(table.ParentCatalog(), context);

		unique_ptr<FunctionData> bind_data;
		auto scan_function = table.GetScanFunction(context, bind_data, table_lookup);
		// TODO: bundle the type and name vector in a struct (e.g PackedColumnMetadata)
		vector<LogicalType> table_types;
		vector<string> table_names;
		vector<TableColumnType> table_categories;

		vector<LogicalType> return_types;
		vector<string> return_names;
		for (auto &col : table.GetColumns().Logical()) {
			table_types.push_back(col.Type());
			table_names.push_back(col.Name());
			return_types.push_back(col.Type());
			return_names.push_back(col.Name());
		}
		table_names = BindContext::AliasColumnNames(ref.table_name, table_names, ref.column_name_alias);

		virtual_column_map_t virtual_columns;
		if (scan_function.get_virtual_columns) {
			virtual_columns = scan_function.get_virtual_columns(context, bind_data.get());
		} else {
			virtual_columns = table.GetVirtualColumns();
		}
		auto logical_get =
		    make_uniq<LogicalGet>(table_index, scan_function, std::move(bind_data), std::move(return_types),
		                          std::move(return_names), std::move(virtual_columns));
		auto table_entry = logical_get->GetTable();
		auto &col_ids = logical_get->GetMutableColumnIds();
		if (!table_entry) {
			bind_context.AddBaseTable(table_index, ref.alias, table_names, table_types, col_ids, ref.table_name);
		} else {
			bind_context.AddBaseTable(table_index, ref.alias, table_names, table_types, col_ids, *table_entry);
		}
		return make_uniq_base<BoundTableRef, BoundBaseTableRef>(table, std::move(logical_get));
	}
	case CatalogType::VIEW_ENTRY: {
		// the node is a view: get the query that the view represents
		auto &view_catalog_entry = table_or_view->Cast<ViewCatalogEntry>();
		// We need to use a new binder for the view that doesn't reference any CTEs
		// defined for this binder so there are no collisions between the CTEs defined
		// for the view and for the current query
		auto view_binder = Binder::CreateBinder(context, this, BinderType::VIEW_BINDER);
		view_binder->can_contain_nulls = true;
		SubqueryRef subquery(unique_ptr_cast<SQLStatement, SelectStatement>(view_catalog_entry.GetQuery().Copy()));
		subquery.alias = ref.alias;
		// construct view names by first (1) taking the view aliases, (2) adding the view names, then (3) applying
		// subquery aliases
		vector<string> view_names = view_catalog_entry.aliases;
		for (idx_t n = view_names.size(); n < view_catalog_entry.names.size(); n++) {
			view_names.push_back(view_catalog_entry.names[n]);
		}
		subquery.column_name_alias = BindContext::AliasColumnNames(ref.table_name, view_names, ref.column_name_alias);

		// when binding a view, we always look into the catalog/schema where the view is stored first
		auto view_search_path =
		    GetSearchPath(view_catalog_entry.ParentCatalog(), view_catalog_entry.ParentSchema().name);
		view_binder->entry_retriever.SetSearchPath(std::move(view_search_path));
		// propagate the AT clause through the view
		view_binder->entry_retriever.SetAtClause(entry_at_clause);

		// bind the child subquery
		view_binder->AddBoundView(view_catalog_entry);
		auto bound_child = view_binder->Bind(subquery);
		if (!view_binder->correlated_columns.empty()) {
			throw BinderException("Contents of view were altered - view bound correlated columns");
		}

		D_ASSERT(bound_child->type == TableReferenceType::SUBQUERY);
		// verify that the types and names match up with the expected types and names if the view has type info defined
		auto &bound_subquery = bound_child->Cast<BoundSubqueryRef>();
		if (GetBindingMode() != BindingMode::EXTRACT_NAMES && view_catalog_entry.HasTypes()) {
			// we bind the view subquery and the original view with different "can_contain_nulls",
			// but we don't want to throw an error when SQLNULL does not match up with INTEGER,
			// so we exchange all SQLNULL with INTEGER here before comparing
			auto bound_types = ExchangeAllNullTypes(bound_subquery.subquery->types);
			auto view_types = ExchangeAllNullTypes(view_catalog_entry.types);
			if (bound_types != view_types) {
				auto actual_types = StringUtil::ToString(bound_types, ", ");
				auto expected_types = StringUtil::ToString(view_types, ", ");
				throw BinderException(
				    "Contents of view were altered: types don't match! Expected [%s], but found [%s] instead",
				    expected_types, actual_types);
			}
			if (bound_subquery.subquery->names.size() == view_catalog_entry.names.size() &&
			    bound_subquery.subquery->names != view_catalog_entry.names) {
				auto actual_names = StringUtil::Join(bound_subquery.subquery->names, ", ");
				auto expected_names = StringUtil::Join(view_catalog_entry.names, ", ");
				throw BinderException(
				    "Contents of view were altered: names don't match! Expected [%s], but found [%s] instead",
				    expected_names, actual_names);
			}
		}
		bind_context.AddView(bound_subquery.subquery->GetRootIndex(), subquery.alias, subquery,
		                     *bound_subquery.subquery, view_catalog_entry);
		return bound_child;
	}
	default:
		throw InternalException("Catalog entry type");
	}
}